

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  pointer pbVar1;
  bool bVar2;
  string *psVar3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  pointer pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  MapSourceFileFlags sourceFileFlags;
  string local_450;
  string varValue;
  string systemName;
  cmGeneratedFileStream fout;
  string varName;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) goto LAB_002933e0;
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::RelativePath(&local_450,psVar3,psVar4);
  std::operator<<((ostream *)&fout,"{\n");
  std::operator<<((ostream *)&fout,"\t\"folders\":\n\t[\n\t");
  if (local_450._M_string_length == 0) {
    std::operator<<((ostream *)&fout,"\t{\n\t\t\t\"path\": \"./\"");
  }
  else {
    poVar5 = std::operator<<((ostream *)&fout,"\t{\n\t\t\t\"path\": \"");
    poVar5 = std::operator<<(poVar5,(string *)&local_450);
    std::operator<<(poVar5,"\"");
    psVar3 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath(&varName,psVar3,psVar4);
    if (varName._M_string_length != 0) {
      if (2 < varName._M_string_length) {
        std::__cxx11::string::substr((ulong)&sourceFileFlags,(ulong)&varName);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&sourceFileFlags,"../");
        std::__cxx11::string::~string((string *)&sourceFileFlags);
        if (!bVar2) goto LAB_002930b9;
      }
      if (this->ExcludeBuildFolder == true) {
        poVar5 = std::operator<<((ostream *)&fout,",\n\t\t\t\"folder_exclude_patterns\": [\"");
        poVar5 = std::operator<<(poVar5,(string *)&varName);
        std::operator<<(poVar5,"\"]");
      }
    }
LAB_002930b9:
    std::__cxx11::string::~string((string *)&varName);
  }
  std::operator<<((ostream *)&fout,"\n\t\t}");
  std::operator<<((ostream *)&fout,"\n\t]");
  std::operator<<((ostream *)&fout,",\n\t\"build_systems\":\n\t[\n\t");
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  AppendAllTargets(this,lgs,mf,&fout,&sourceFileFlags);
  std::operator<<((ostream *)&fout,"\n\t]");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&varName,"CMAKE_SYSTEM_NAME",(allocator<char> *)&varValue);
  psVar3 = cmMakefile::GetSafeDefinition(mf,&varName);
  std::__cxx11::string::string((string *)&systemName,(string *)psVar3);
  std::__cxx11::string::~string((string *)&varName);
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&this->EnvSettings,&tokens,false);
  if ((this->EnvSettings)._M_string_length != 0) {
    std::operator<<((ostream *)&fout,",");
    std::operator<<((ostream *)&fout,"\n\t\"env\":");
    std::operator<<((ostream *)&fout,"\n\t{");
    poVar5 = std::operator<<((ostream *)&fout,"\n\t\t");
    poVar5 = std::operator<<(poVar5,(string *)&systemName);
    std::operator<<(poVar5,":");
    std::operator<<((ostream *)&fout,"\n\t\t{");
    pbVar1 = tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      lVar6 = std::__cxx11::string::find((char)pbVar7,0x3d);
      if (lVar6 == -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&varName);
        poVar5 = std::operator<<((ostream *)&varName,
                                 "Could not parse Env Vars specified in \"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
                                );
        poVar5 = std::operator<<(poVar5,", corrupted string ");
        std::operator<<(poVar5,(string *)pbVar7);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&varValue);
        std::__cxx11::string::~string((string *)&varValue);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&varName);
      }
      else {
        std::__cxx11::string::substr((ulong)&varName,(ulong)pbVar7);
        std::__cxx11::string::substr((ulong)&varValue,(ulong)pbVar7);
        poVar5 = std::operator<<((ostream *)&fout,"\n\t\t\t\"");
        poVar5 = std::operator<<(poVar5,(string *)&varName);
        poVar5 = std::operator<<(poVar5,"\":\"");
        poVar5 = std::operator<<(poVar5,(string *)&varValue);
        std::operator<<(poVar5,"\"");
        std::__cxx11::string::~string((string *)&varValue);
        std::__cxx11::string::~string((string *)&varName);
      }
    }
    std::operator<<((ostream *)&fout,"\n\t\t}");
    std::operator<<((ostream *)&fout,"\n\t}");
  }
  std::operator<<((ostream *)&fout,"\n}");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  std::__cxx11::string::~string((string *)&systemName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&sourceFileFlags._M_t);
  std::__cxx11::string::~string((string *)&local_450);
LAB_002933e0:
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  const std::string& sourceRootRelativeToOutput = cmSystemTools::RelativePath(
    lgs[0]->GetBinaryDirectory(), lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty()) {
    fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
    const std::string& outputRelativeToSourceRoot =
      cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                  lgs[0]->GetBinaryDirectory());
    if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
         (outputRelativeToSourceRoot.substr(0, 3) != "../"))) {
      if (this->ExcludeBuildFolder) {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\""
             << outputRelativeToSourceRoot << "\"]";
      }
    }
  } else {
    fout << "\t{\n\t\t\t\"path\": \"./\"";
  }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::vector<std::string> tokens;
  cmSystemTools::ExpandListArgument(this->EnvSettings, tokens);

  if (!this->EnvSettings.empty()) {
    fout << ",";
    fout << "\n\t\"env\":";
    fout << "\n\t{";
    fout << "\n\t\t" << systemName << ":";
    fout << "\n\t\t{";
    for (std::string const& t : tokens) {
      size_t const pos = t.find_first_of('=');

      if (pos != std::string::npos) {
        std::string varName = t.substr(0, pos);
        std::string varValue = t.substr(pos + 1);

        fout << "\n\t\t\t\"" << varName << "\":\"" << varValue << "\"";
      } else {
        std::ostringstream e;
        e << "Could not parse Env Vars specified in "
             "\"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS\""
          << ", corrupted string " << t;
        mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
    }
    fout << "\n\t\t}";
    fout << "\n\t}";
  }
  fout << "\n}";
}